

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O2

void __thiscall
Scene::render_pass(Scene *this,RenderPass pass,Shadow shadow,bool light_projection,int display_w,
                  int display_h,ResourcePack *resource_pack,Camera *camera)

{
  GLuint GVar1;
  GLint GVar2;
  Mesh *pMVar3;
  ostream *poVar4;
  mat<4,_4,_float,_(glm::qualifier)0> *m2;
  undefined4 in_register_00000084;
  vec<3,_float,_(glm::qualifier)0> *up;
  mat<4,_4,_float,_(glm::qualifier)0> *__return_storage_ptr__;
  string *local_260;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 local_258;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aStack_254;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 aStack_250;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aStack_24c;
  undefined4 local_248;
  undefined4 uStack_244;
  undefined8 uStack_240;
  col_type local_238;
  col_type local_228;
  mat4 lightProjection;
  string depthmap_shader;
  string box_mesh;
  string blue_shader;
  string shadowpcf_shader;
  mat4 mvp;
  string shadow_shader;
  mat4 depth_mvp;
  mat4 lightView;
  mat4 depth_bias_mvp;
  
  up = (vec<3,_float,_(glm::qualifier)0> *)CONCAT44(in_register_00000084,display_w);
  local_260 = &shadow_shader;
  std::__cxx11::string::string((string *)local_260,"shadow",(allocator *)&mvp);
  std::__cxx11::string::string((string *)&shadowpcf_shader,"shadowpcf",(allocator *)&mvp);
  std::__cxx11::string::string((string *)&blue_shader,"blue",(allocator *)&mvp);
  std::__cxx11::string::string((string *)&box_mesh,"box",(allocator *)&mvp);
  std::__cxx11::string::string((string *)&depthmap_shader,"depthmap",(allocator *)&mvp);
  if (pass == GenerateDepthMap) {
    glViewport(0,0,this->shadow_width,this->shadow_height);
    (*__glewBindFramebuffer)(0x8d40,this->depth_map_framebuffer);
    glClear(0x100);
    glCullFace(0x404);
  }
  else if (pass == Display) {
    glViewport(0,0,display_w,display_h);
    glClear(0x4100);
  }
  Camera::get_projection(&lightView,camera,(float)display_w / (float)display_h);
  Camera::get_view(&lightProjection,camera);
  glm::operator*(&mvp,&lightView,&lightProjection);
  local_258.x = 0.0;
  aStack_254.y = 0.0;
  aStack_250.z = 0.0;
  lightProjection.value[0].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0xc0000000;
  lightProjection.value[0].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x40800000;
  lightProjection.value[0].field_2.z = -1.0;
  depth_mvp.value[0].field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
  depth_mvp.value[0].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x3f800000;
  depth_mvp.value[0].field_2.z = 0.0;
  glm::lookAtRH<float,(glm::qualifier)0>
            (&lightView,(glm *)&lightProjection,(vec<3,_float,_(glm::qualifier)0> *)&local_258,
             (vec<3,_float,_(glm::qualifier)0> *)&depth_mvp,up);
  if (light_projection) {
    glm::orthoRH_NO<float>
              ((mat<4,_4,_float,_(glm::qualifier)0> *)&local_258,-20.0,20.0,-20.0,20.0,-10.0,20.0);
  }
  else {
    glm::perspectiveRH_NO<float>
              ((mat<4,_4,_float,_(glm::qualifier)0> *)&local_258,0.007853982,
               (float)display_w / (float)display_h,-10.0,20.0);
  }
  lightProjection.value[0].field_1.y = aStack_254.y;
  lightProjection.value[0].field_0.x = local_258.x;
  lightProjection.value[0].field_3 = aStack_24c;
  lightProjection.value[0].field_2.z = aStack_250.z;
  lightProjection.value[3].field_0 = local_228.field_0;
  lightProjection.value[3].field_1 = local_228.field_1;
  lightProjection.value[3].field_2 = local_228.field_2;
  lightProjection.value[3].field_3 = local_228.field_3;
  lightProjection.value[2].field_0 = local_238.field_0;
  lightProjection.value[2].field_1 = local_238.field_1;
  lightProjection.value[2].field_2 = local_238.field_2;
  lightProjection.value[2].field_3 = local_238.field_3;
  lightProjection.value[1].field_2 = uStack_240._0_4_;
  lightProjection.value[1].field_3 = uStack_240._4_4_;
  local_258.x = 0.5;
  aStack_254 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
  aStack_250 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
  aStack_24c.w = 0.0;
  local_248 = 0;
  uStack_244 = 0x3f000000;
  uStack_240 = 0;
  local_238.field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
  local_238.field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
  local_238.field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x3f000000;
  local_238.field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
  local_228.field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x3f000000;
  local_228.field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x3f000000;
  local_228.field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x3f000000;
  local_228.field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x3f800000;
  glm::operator*(&depth_mvp,&lightProjection,&lightView);
  __return_storage_ptr__ = &depth_bias_mvp;
  m2 = &depth_mvp;
  glm::operator*(__return_storage_ptr__,(mat<4,_4,_float,_(glm::qualifier)0> *)&local_258,m2);
  (*__glewEnableVertexAttribArray)(0);
  (*__glewBindBuffer)(0x8892,this->grid_vertex_buffer);
  (*__glewVertexAttribPointer)(0,3,0x1406,'\0',0,(void *)0x0);
  if (pass == Display) {
    glBindTexture(0xde1,this->depth_map);
    if (shadow != ShadowMapping) {
      if (shadow != ShadowMappingPCF) {
        poVar4 = std::operator<<((ostream *)&std::cout,"UNIMPLEMENTED");
        std::endl<char,std::char_traits<char>>(poVar4);
        exit(1);
      }
      local_260 = &shadowpcf_shader;
    }
    GVar1 = ResourcePack::get_program(resource_pack,local_260);
    (*__glewUseProgram)(GVar1);
    GVar2 = (*__glewGetUniformLocation)(GVar1,"mvp");
    (*__glewUniformMatrix4fv)(GVar2,1,'\0',(GLfloat *)&mvp);
    GVar2 = (*__glewGetUniformLocation)(GVar1,"depth_bias_mvp");
    m2 = &depth_bias_mvp;
LAB_001b4d40:
    (*__glewUniformMatrix4fv)(GVar2,1,'\0',(GLfloat *)m2);
  }
  else if (pass == GenerateDepthMap) {
    GVar1 = ResourcePack::get_program(resource_pack,&depthmap_shader);
    (*__glewUseProgram)(GVar1);
    GVar2 = (*__glewGetUniformLocation)(GVar1,"depth_mvp");
    goto LAB_001b4d40;
  }
  (*__glewBindBuffer)(0x8893,this->grid_index_buffer);
  glDrawElements(4,(ulong)((long)(this->grid_indices).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->grid_indices).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 2,0x1405,0);
  (*__glewDisableVertexAttribArray)(0);
  (*__glewEnableVertexAttribArray)(0);
  (*__glewBindBuffer)(0x8892,this->object_vertex_buffer);
  (*__glewVertexAttribPointer)(0,3,0x1406,'\0',0,(void *)0x0);
  if (pass == Display) {
    (*__glewEnableVertexAttribArray)(1);
    (*__glewBindBuffer)(0x8892,this->object_normal_buffer);
    (*__glewVertexAttribPointer)(1,3,0x1406,'\0',0,(void *)0x0);
    glBindTexture(0xde1,this->depth_map);
    GVar1 = ResourcePack::get_program(resource_pack,&blue_shader);
    (*__glewUseProgram)(GVar1);
    GVar2 = (*__glewGetUniformLocation)(GVar1,"mvp");
    (*__glewUniformMatrix4fv)(GVar2,1,'\0',(GLfloat *)&mvp);
    GVar2 = (*__glewGetUniformLocation)(GVar1,"depth_bias_mvp");
  }
  else {
    if (pass != GenerateDepthMap) goto LAB_001b4eb8;
    GVar1 = ResourcePack::get_program(resource_pack,&depthmap_shader);
    (*__glewUseProgram)(GVar1);
    GVar2 = (*__glewGetUniformLocation)(GVar1,"depth_mvp");
    __return_storage_ptr__ = &depth_mvp;
  }
  (*__glewUniformMatrix4fv)(GVar2,1,'\0',(GLfloat *)__return_storage_ptr__);
LAB_001b4eb8:
  pMVar3 = ResourcePack::get_mesh(resource_pack,&box_mesh);
  glDrawArrays(4,0,(ulong)((long)(pMVar3->vertices).
                                 super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)(pMVar3->vertices).super__Vector_base<float,_std::allocator<float>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 2);
  (*__glewDisableVertexAttribArray)(0);
  if (pass == Display) {
    (*__glewDisableVertexAttribArray)(1);
  }
  else if (pass == GenerateDepthMap) {
    (*__glewBindFramebuffer)(0x8d40,0);
    glCullFace(0x405);
  }
  std::__cxx11::string::~string((string *)&depthmap_shader);
  std::__cxx11::string::~string((string *)&box_mesh);
  std::__cxx11::string::~string((string *)&blue_shader);
  std::__cxx11::string::~string((string *)&shadowpcf_shader);
  std::__cxx11::string::~string((string *)&shadow_shader);
  return;
}

Assistant:

void Scene::render_pass(RenderPass pass, Shadow shadow, bool light_projection, int display_w, int display_h, ResourcePack& resource_pack, Camera& camera) {
    std::string shadow_shader("shadow");
    std::string shadowpcf_shader("shadowpcf");
    std::string blue_shader("blue");
    std::string box_mesh("box");
    std::string depthmap_shader("depthmap");
    GLuint uniform = -1;
    GLuint program_id = -1;

    switch (pass) {
        case RenderPass::GenerateDepthMap:
            glViewport(0, 0, shadow_width, shadow_height);
            glBindFramebuffer(GL_FRAMEBUFFER, depth_map_framebuffer);
            glClear(GL_DEPTH_BUFFER_BIT);
            glCullFace(GL_FRONT);
            break;
        case RenderPass::Display:
            glViewport(0, 0, display_w, display_h);
            glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
            break;
    }

    glm::mat4 mvp = camera.get_projection(static_cast<float>(display_w)/display_h) * camera.get_view();
    float near_plane = -10.0f, far_plane = 20.0f;
    glm::mat4 lightView = glm::lookAt(
        glm::vec3(-2.0f, 4.0f, -1.0f),
        glm::vec3(0.0f, 0.0f,  0.0f),
        glm::vec3(0.0f, 1.0f,  0.0f)
    );
    glm::mat4 lightProjection;
    if (light_projection) {
        lightProjection = glm::ortho(-20.0f, 20.0f, -20.0f, 20.0f, near_plane, far_plane);
    }
    else {
        lightProjection = glm::perspective(
            (float)glm::radians(0.45),
            static_cast<float>(display_w)/display_h,
            near_plane,
            far_plane
        );
    }
    glm::mat4 bias(
        0.5, 0.0, 0.0, 0.0,
        0.0, 0.5, 0.0, 0.0,
        0.0, 0.0, 0.5, 0.0,
        0.5, 0.5, 0.5, 1.0
    );
    glm::mat4 depth_mvp = lightProjection * lightView;
    glm::mat4 depth_bias_mvp = bias * depth_mvp;

    // Draw ground
    glEnableVertexAttribArray(0);
    glBindBuffer(GL_ARRAY_BUFFER, grid_vertex_buffer);
    glVertexAttribPointer(
        0,
        3,
        GL_FLOAT,
        GL_FALSE,
        0,
        (void*)0
    );

    if (pass == RenderPass::Display) {
        glBindTexture(GL_TEXTURE_2D, depth_map);
    }

    switch (pass) {
        case RenderPass::GenerateDepthMap:
            program_id = resource_pack.get_program(depthmap_shader);
            glUseProgram(program_id);
            uniform = glGetUniformLocation(program_id, "depth_mvp");
            glUniformMatrix4fv(uniform, 1, GL_FALSE, &depth_mvp[0][0]);
            break;
        case RenderPass::Display:
            switch (shadow) {
                case Shadow::ShadowMapping:
                    program_id = resource_pack.get_program(shadow_shader);
                    break;
                case Shadow::ShadowMappingPCF:
                    program_id = resource_pack.get_program(shadowpcf_shader);
                    break;
                default:
                    std::cout << "UNIMPLEMENTED" << std::endl;
                    exit(1);
            }
            glUseProgram(program_id);
            uniform = glGetUniformLocation(program_id, "mvp");
            glUniformMatrix4fv(uniform, 1, GL_FALSE, &mvp[0][0]);
            uniform = glGetUniformLocation(program_id, "depth_bias_mvp");
            glUniformMatrix4fv(uniform, 1, GL_FALSE, &depth_bias_mvp[0][0]);
            break;
    }

    glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, grid_index_buffer);
    glDrawElements(GL_TRIANGLES, grid_indices.size(), GL_UNSIGNED_INT, 0);

    glDisableVertexAttribArray(0);

    // Draw object
    glEnableVertexAttribArray(0);
    glBindBuffer(GL_ARRAY_BUFFER, object_vertex_buffer);
    glVertexAttribPointer(
        0,
        3,
        GL_FLOAT,
        GL_FALSE,
        0,
        (void*)0
    );

    if (pass == RenderPass::Display) {
        glEnableVertexAttribArray(1);
        glBindBuffer(GL_ARRAY_BUFFER, object_normal_buffer);
        glVertexAttribPointer(
            1,
            3,
            GL_FLOAT,
            GL_FALSE,
            0,
            (void*)0
        );
    }

    if (pass == RenderPass::Display) {
        glBindTexture(GL_TEXTURE_2D, depth_map);
    }

    switch (pass) {
        case RenderPass::GenerateDepthMap:
            program_id = resource_pack.get_program(depthmap_shader);
            glUseProgram(program_id);
            uniform = glGetUniformLocation(program_id, "depth_mvp");
            glUniformMatrix4fv(uniform, 1, GL_FALSE, &depth_mvp[0][0]);
            break;
        case RenderPass::Display:
            program_id = resource_pack.get_program(blue_shader);
            glUseProgram(program_id);
            uniform = glGetUniformLocation(program_id, "mvp");
            glUniformMatrix4fv(uniform, 1, GL_FALSE, &mvp[0][0]);
            uniform = glGetUniformLocation(program_id, "depth_bias_mvp");
            glUniformMatrix4fv(uniform, 1, GL_FALSE, &depth_bias_mvp[0][0]);
            break;
    }

    glDrawArrays(GL_TRIANGLES, 0, resource_pack.get_mesh(box_mesh)->vertices.size());

    glDisableVertexAttribArray(0);

    if (pass == RenderPass::Display) {
        glDisableVertexAttribArray(1);
    }

    switch (pass) {
        case RenderPass::GenerateDepthMap:
            glBindFramebuffer(GL_FRAMEBUFFER, 0);
            glCullFace(GL_BACK);
            break;
        case RenderPass::Display:
            break;
    }
}